

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_d6fcf8::TGlslangToSpvTraverser::isTrivialLeaf
          (TGlslangToSpvTraverser *this,TIntermTyped *node)

{
  byte bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar3;
  uint uVar4;
  
  if (this == (TGlslangToSpvTraverser *)0x0) {
    bVar1 = 0;
  }
  else {
    iVar2 = (*(this->super_TIntermTraverser)._vptr_TIntermTraverser[0x11])();
    bVar1 = 1;
    if (CONCAT44(extraout_var,iVar2) == 0) {
      iVar2 = (*(this->super_TIntermTraverser)._vptr_TIntermTraverser[0x18])(this);
      if (CONCAT44(extraout_var_00,iVar2) != 0) {
        iVar2 = (*(this->super_TIntermTraverser)._vptr_TIntermTraverser[0x1e])(this);
        lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x58))
                          ((long *)CONCAT44(extraout_var_01,iVar2));
        uVar4 = *(uint *)(lVar3 + 8) & 0x7f;
        if (uVar4 < 0x14) {
          bVar1 = (byte)(0xd0027 >> ((byte)uVar4 & 0x1f));
          goto LAB_003c1983;
        }
      }
      bVar1 = 0;
    }
  }
LAB_003c1983:
  return (bool)(bVar1 & 1);
}

Assistant:

bool TGlslangToSpvTraverser::isTrivialLeaf(const glslang::TIntermTyped* node)
{
    // don't know what this is
    if (node == nullptr)
        return false;

    // a constant is safe
    if (node->getAsConstantUnion() != nullptr)
        return true;

    // not a symbol means non-trivial
    if (node->getAsSymbolNode() == nullptr)
        return false;

    // a symbol, depends on what's being read
    switch (node->getType().getQualifier().storage) {
    case glslang::EvqTemporary:
    case glslang::EvqGlobal:
    case glslang::EvqIn:
    case glslang::EvqInOut:
    case glslang::EvqConst:
    case glslang::EvqConstReadOnly:
    case glslang::EvqUniform:
        return true;
    default:
        return false;
    }
}